

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O2

mp_int ** get_out_val_mpint(BinarySource *in)

{
  Value *ctx;
  
  ctx = value_new(VT_mpint);
  add_finaliser(finaliser_return_value,ctx);
  return (mp_int **)&ctx->field_2;
}

Assistant:

static mp_int **get_out_val_mpint(BinarySource *in)
{
    Value *val = value_new(VT_mpint);
    add_finaliser(finaliser_return_value, val);
    return &val->vu_mpint;
}